

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,IVal *value)

{
  long lVar1;
  long lVar2;
  IVal *pIVar3;
  bool *pbVar4;
  byte bVar5;
  IVal IStack_78;
  
  bVar5 = 0;
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0xd8; lVar2 = lVar2 + 0x48) {
    ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
              (&IStack_78,fmt,(IVal *)(&(value->m_data).m_data[0].m_data[0].m_hasNaN + lVar2));
    pIVar3 = &IStack_78;
    pbVar4 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar2;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pbVar4 = *(undefined8 *)pIVar3;
      pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pbVar4 = pbVar4 + ((ulong)bVar5 * -2 + 1) * 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doConvert		(const FloatFormat& fmt, const IVal& value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = convert<Element>(fmt, value[ndx]);

		return ret;
	}